

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O2

double __thiscall
despot::DESPOT::CheckDESPOTSTAR(DESPOT *this,VNode *vnode,double regularized_value)

{
  History *history;
  pointer ppSVar1;
  DSPOMDP *pDVar2;
  int iVar3;
  ostream *poVar4;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvVar5;
  undefined4 extraout_var;
  VNode *this_00;
  clock_t cVar6;
  VNode *vnode_00;
  clock_t cVar7;
  clock_t cVar8;
  clock_t cVar9;
  int i;
  ulong uVar10;
  double dVar11;
  double local_88;
  RandomStreams streams;
  vector<despot::State_*,_std::allocator<despot::State_*>_> copy;
  
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  pvVar5 = VNode::particles(vnode);
  copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar10 = 0;
  while( true ) {
    ppSVar1 = (pvVar5->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pvVar5->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar10)
    break;
    pDVar2 = (this->super_Solver).model_;
    iVar3 = (*pDVar2->_vptr_DSPOMDP[0x16])(pDVar2,ppSVar1[uVar10]);
    streams.streams_.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar3);
    std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
              ((vector<despot::State*,std::allocator<despot::State*>> *)&copy,(State **)&streams);
    uVar10 = uVar10 + 1;
  }
  this_00 = (VNode *)operator_new(0x98);
  VNode::VNode(this_00,&copy,0,(QNode *)0x0,0xffffffffffffffff);
  RandomStreams::RandomStreams(&streams,DAT_0019fdcc,DAT_0019fdd0);
  history = &(this->super_Solver).history_;
  InitBounds(this_00,this->lower_bound_,this->upper_bound_,&streams,history);
  iVar3 = 0;
  local_88 = 0.0;
  do {
    cVar6 = clock();
    vnode_00 = Trial(this_00,&streams,this->lower_bound_,this->upper_bound_,
                     (this->super_Solver).model_,history,(SearchStatistics *)0x0);
    cVar7 = clock();
    cVar8 = clock();
    Backup(vnode_00);
    cVar9 = clock();
    dVar11 = VNode::lower_bound(this_00);
    local_88 = ((double)cVar9 - (double)cVar8) / 1000000.0 +
               local_88 + ((double)cVar7 - (double)cVar6) / 1000000.0;
    iVar3 = iVar3 + 1;
  } while (dVar11 < regularized_value);
  poVar4 = std::operator<<((ostream *)&std::cout,"DESPOT: # trials = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::operator<<(poVar4,"; target = ");
  poVar4 = std::ostream::_M_insert<double>(regularized_value);
  std::operator<<(poVar4,", current = ");
  dVar11 = VNode::lower_bound(this_00);
  poVar4 = std::ostream::_M_insert<double>(dVar11);
  std::operator<<(poVar4,", l = ");
  dVar11 = VNode::lower_bound(this_00);
  poVar4 = std::ostream::_M_insert<double>(dVar11);
  std::operator<<(poVar4,", u = ");
  dVar11 = VNode::upper_bound(this_00);
  poVar4 = std::ostream::_M_insert<double>(dVar11);
  std::operator<<(poVar4,"; time = ");
  poVar4 = std::ostream::_M_insert<double>(local_88);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  VNode::Free(this_00,(this->super_Solver).model_);
  VNode::~VNode(this_00);
  operator_delete(this_00,0x98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&streams.streams_);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
            (&copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
  return local_88;
}

Assistant:

double DESPOT::CheckDESPOTSTAR(const VNode* vnode, double regularized_value) {
	cout
		<< "--------------------------------------------------------------------------------"
		<< endl;

	const vector<State*>& particles = vnode->particles();
	vector<State*> copy;
	for (int i = 0; i < particles.size(); i++) {
		copy.push_back(model_->Copy(particles[i]));
	}
	VNode* root = new VNode(copy);

	RandomStreams streams = RandomStreams(Globals::config.num_scenarios,
		Globals::config.search_depth);
	InitBounds(root, lower_bound_, upper_bound_, streams, history_);

	double used_time = 0;
	int num_trials = 0;
	do {
		double start = clock();
		VNode* cur = Trial(root, streams, lower_bound_, upper_bound_, model_, history_);
		num_trials++;
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		start = clock();
		Backup(cur);
		used_time += double(clock() - start) / CLOCKS_PER_SEC;
	} while (root->lower_bound() < regularized_value);

	cout << "DESPOT: # trials = " << num_trials << "; target = "
		<< regularized_value << ", current = " << root->lower_bound()
		<< ", l = " << root->lower_bound() << ", u = " << root->upper_bound()
		<< "; time = " << used_time << endl;
	cout
		<< "--------------------------------------------------------------------------------"
		<< endl;

	root->Free(*model_);
	delete root;

	return used_time;
}